

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

double __thiscall
HEkkPrimal::computePrimalSteepestEdgeWeight(HEkkPrimal *this,HighsInt iVar,HVector *local_col_aq)

{
  HVector *in_RDX;
  undefined4 in_ESI;
  HighsTimerClock *in_RDI;
  double dVar1;
  HVectorBase<double> *unaff_retaddr;
  double local_col_aq_density;
  double in_stack_00000058;
  HighsInt in_stack_00000064;
  HVector *in_stack_00000068;
  HighsSparseMatrix *in_stack_00000070;
  double in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  HVectorBase<double>::clear(unaff_retaddr);
  HighsSparseMatrix::collectAj
            (in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000058);
  in_RDX->packFlag = false;
  HSimplexNla::ftran((HSimplexNla *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
                     in_stack_ffffffffffffffe0,in_RDI);
  HEkk::updateOperationResultDensity
            ((HEkk *)in_RDI->timer_pointer_,
             ((double)in_RDX->count * 1.0) /
             (double)*(int *)((long)&in_RDI->timer_pointer_[0x3f].clock_num_call.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish + 4),
             (double *)
             &in_RDI->timer_pointer_[0x4b].clock_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  dVar1 = HVectorBase<double>::norm2(local_col_aq);
  return dVar1 + 1.0;
}

Assistant:

double HEkkPrimal::computePrimalSteepestEdgeWeight(const HighsInt iVar,
                                                   HVector& local_col_aq) {
  local_col_aq.clear();
  ekk_instance_.lp_.a_matrix_.collectAj(local_col_aq, iVar, 1);
  local_col_aq.packFlag = false;
  ekk_instance_.simplex_nla_.ftran(
      local_col_aq, ekk_instance_.info_.col_aq_density,
      ekk_instance_.analysis_.pointer_serial_factor_clocks);
  const double local_col_aq_density =
      (1.0 * local_col_aq.count) / ekk_instance_.lp_.num_row_;
  ekk_instance_.updateOperationResultDensity(
      local_col_aq_density, ekk_instance_.info_.col_aq_density);
  return 1 + local_col_aq.norm2();
}